

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiViewportP *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  int n;
  ulong uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar9 = GImGui;
  pIVar3 = window->Viewport;
  if ((pIVar3 == viewport) || (((viewport->super_ImGuiViewport).Flags & 0x1400U) != 0x1000)) {
    return false;
  }
  fVar21 = (window->Pos).x;
  fVar22 = (window->Pos).y;
  IVar1 = (viewport->super_ImGuiViewport).Pos;
  fVar19 = IVar1.x;
  if (fVar21 < fVar19) {
    return false;
  }
  fVar20 = IVar1.y;
  uVar8 = -(ushort)(fVar20 <= fVar22);
  if ((uVar8 & 1) == 0) {
    return false;
  }
  IVar1 = (viewport->super_ImGuiViewport).Size;
  fVar23 = (window->Size).x + fVar21;
  fVar24 = (window->Size).y + fVar22;
  iVar16 = -(uint)(fVar23 <= fVar19 + IVar1.x);
  iVar17 = -(uint)(fVar24 <= fVar20 + IVar1.y);
  auVar6._4_4_ = iVar16;
  auVar6._0_4_ = iVar16;
  auVar6._8_4_ = iVar17;
  auVar6._12_4_ = iVar17;
  uVar13 = movmskpd((uint)uVar8,auVar6);
  if ((uVar13 & 1) == 0) {
    return false;
  }
  if ((byte)((byte)uVar13 >> 1) == 0) {
    return false;
  }
  bVar10 = GetWindowAlwaysWantOwnViewport(window);
  if (bVar10) {
    return false;
  }
  iVar16 = (pIVar9->Windows).Size;
  uVar11 = (ulong)iVar16;
  if (0 < (long)uVar11) {
    uVar14 = 0;
    do {
      pIVar4 = (pIVar9->Windows).Data[uVar14];
      if (pIVar4 == window) break;
      if (((pIVar4->WasActive == true) && (pIVar4->ViewportOwned == true)) &&
         ((pIVar4->Flags & 0x1000000) == 0)) {
        pIVar5 = pIVar4->Viewport;
        IVar1 = (pIVar5->super_ImGuiViewport).Pos;
        IVar2 = (pIVar5->super_ImGuiViewport).Size;
        fVar19 = IVar1.x;
        fVar20 = IVar1.y;
        iVar17 = -(uint)(fVar21 < IVar2.x + fVar19);
        iVar18 = -(uint)(fVar22 < IVar2.y + fVar20);
        auVar7._4_4_ = iVar17;
        auVar7._0_4_ = iVar17;
        auVar7._8_4_ = iVar18;
        auVar7._12_4_ = iVar18;
        uVar13 = movmskpd((int)pIVar5,auVar7);
        if ((((uVar13 & 2) != 0) && (fVar20 < fVar24)) && (((uVar13 & 1) != 0 && (fVar19 < fVar23)))
           ) {
          return false;
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
    bVar12 = window->ViewportOwned;
    if ((0 < iVar16 & bVar12) == 0) goto LAB_0012785c;
    lVar15 = 0;
    do {
      pIVar4 = (pIVar9->Windows).Data[lVar15];
      pIVar5 = pIVar4->Viewport;
      if (pIVar5 == pIVar3) {
        if ((pIVar4->ViewportOwned == true) && (pIVar5->Window == pIVar4)) {
          (pIVar5->super_ImGuiViewport).Size.x = 0.0;
          (pIVar5->super_ImGuiViewport).Size.y = 0.0;
          uVar11 = (ulong)(uint)(pIVar9->Windows).Size;
        }
        pIVar4->Viewport = viewport;
        pIVar4->ViewportId = (viewport->super_ImGuiViewport).ID;
        pIVar4->ViewportOwned = viewport->Window == pIVar4;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar11);
  }
  bVar12 = window->ViewportOwned;
LAB_0012785c:
  if (((bVar12 & 1) != 0) && (pIVar3 = window->Viewport, pIVar3->Window == window)) {
    (pIVar3->super_ImGuiViewport).Size.x = 0.0;
    (pIVar3->super_ImGuiViewport).Size.y = 0.0;
  }
  window->Viewport = viewport;
  window->ViewportId = (viewport->super_ImGuiViewport).ID;
  window->ViewportOwned = viewport->Window == window;
  BringWindowToDisplayFront(window);
  return true;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (window->Viewport == viewport)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows) == 0)
        return false;
    if ((viewport->Flags & ImGuiViewportFlags_Minimized) != 0)
        return false;
    if (!viewport->GetMainRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    // FIXME: Can't use g.WindowsFocusOrder[] for root windows only as we care about Z order. If we maintained a DisplayOrder along with FocusOrder we could..
    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetMainRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}